

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

int __thiscall dnet::data_types::tensor<int,_3U>::init(tensor<int,_3U> *this,EVP_PKEY_CTX *ctx)

{
  index_type i;
  uint uVar1;
  int extraout_EAX;
  long lVar2;
  int i_1;
  uint uVar3;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    (this->_axes_sort)._M_elems[lVar2] = (uint)lVar2;
  }
  uVar3 = 2;
  uVar1 = 1;
  while( true ) {
    if ((int)uVar3 < 0) break;
    (this->_facts)._M_elems[uVar3] = uVar1;
    uVar1 = uVar1 * *(int *)(ctx + (ulong)uVar3 * 4);
    uVar3 = uVar3 - 1;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->_data,(ulong)uVar1);
  return extraout_EAX;
}

Assistant:

void tensor<T, N>::init(const std::array<index_type, N> &sizes)
        {
            for (index_type i = 0; i < this->_axes_sort.size(); i++) {
                _axes_sort[i] = i;
            }
            index_type fact = 1;
            for (int i = N - 1; i >= 0; i--) {
                this->_facts[i] = fact;
                fact *= sizes[i];
            }
            this->_data.resize(fact);
        }